

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree_test.cpp
# Opt level: O0

void __thiscall LazySegtree_LotsOfQueries_Test::TestBody(LazySegtree_LotsOfQueries_Test *this)

{
  int iVar1;
  int iVar2;
  uint fr_00;
  int val;
  int to;
  int fr;
  int it2;
  int it1;
  undefined1 local_60 [8];
  Naive naive;
  Segtree tree;
  int n;
  LazySegtree_LotsOfQueries_Test *this_local;
  
  Segtree::Segtree((Segtree *)
                   &naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,0,100);
  Naive::Naive((Naive *)local_60,100);
  compare((Segtree *)
          &naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage,(Naive *)local_60);
  for (fr = 0; fr < 100; fr = fr + 1) {
    for (to = 0; to < 10; to = to + 1) {
      iVar1 = rand();
      fr_00 = iVar1 % 99;
      iVar1 = rand();
      iVar1 = iVar1 % (int)(~fr_00 + 100) + 1 + fr_00;
      iVar2 = rand();
      Segtree::rangeUpdate
                ((Segtree *)
                 &naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,fr_00,iVar1,(long)(iVar2 % 100));
      Naive::rangeUpdate((Naive *)local_60,fr_00,iVar1,(long)(iVar2 % 100));
    }
    compare((Segtree *)
            &naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(Naive *)local_60);
  }
  Naive::~Naive((Naive *)local_60);
  Segtree::~Segtree((Segtree *)
                    &naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(LazySegtree, LotsOfQueries) {
    int n = 100;
    Segtree tree(0,n);
    Naive naive(n);
    compare(tree, naive);
    
    rep(it1,0,100) {
        rep(it2,0,10) {
            int fr = rand() % (n-1);
            int to = rand() % (n-1-fr) + 1 + fr;
            int val = rand() % 100;

            tree.rangeUpdate(fr, to, val);
            naive.rangeUpdate(fr, to, val);
        }
        compare(tree, naive);
    }
}